

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_file.cpp
# Opt level: O3

void duckdb::ReadFileExecute<duckdb::ReadBlobOperation>
               (ClientContext *context,TableFunctionInput *input,DataChunk *output)

{
  pointer *ppOVar1;
  data_ptr_t pdVar2;
  pointer pcVar3;
  _Head_base<0UL,_duckdb::CachingFileHandle_*,_false> _Var4;
  undefined8 uVar5;
  bool bVar6;
  const_reference path;
  reference pvVar7;
  idx_t val;
  reference pvVar8;
  pointer pCVar9;
  time_t sec;
  timestamp_t tVar10;
  Vector *vector;
  ulong uVar11;
  FileHandle *this;
  int64_t val_00;
  IOException *this_00;
  InternalException *this_01;
  long lVar12;
  idx_t len;
  pointer *__ptr;
  char *pcVar13;
  size_type __n;
  GlobalTableFunctionState *pGVar14;
  Vector *pVVar15;
  Vector *pVVar16;
  string_t sVar17;
  FileOpenFlags flags;
  idx_t actually_read;
  string_t content_string;
  data_ptr_t read_ptr;
  CachingFileSystem fs;
  ErrorData error;
  _Head_base<0UL,_duckdb::CachingFileHandle_*,_false> local_158;
  long local_150;
  DataChunk *local_148;
  const_reference local_140;
  unsigned_long local_138;
  undefined1 local_130 [16];
  idx_t local_120;
  pointer *local_118;
  GlobalTableFunctionState *local_110;
  long local_108;
  reference local_100;
  value_type local_f8;
  vector<unsigned_long,_true> *local_f0;
  data_ptr_t local_e8;
  undefined1 local_e0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  undefined1 local_c0 [112];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_148 = output;
  optional_ptr<const_duckdb::FunctionData,_true>::CheckValid(&input->bind_data);
  ppOVar1 = (pointer *)(input->bind_data).ptr;
  optional_ptr<duckdb::GlobalTableFunctionState,_true>::CheckValid(&input->global_state);
  pGVar14 = (input->global_state).ptr;
  CachingFileSystem::Get((CachingFileSystem *)local_e0,context);
  lVar12 = ((long)ppOVar1[5] - (long)ppOVar1[4] >> 4) * -0x5555555555555555;
  local_120 = lVar12 - (long)pGVar14[1]._vptr_GlobalTableFunctionState;
  if (0x7ff < local_120) {
    local_120 = 0x800;
  }
  local_118 = ppOVar1;
  if (lVar12 - (long)pGVar14[1]._vptr_GlobalTableFunctionState != 0) {
    local_118 = ppOVar1 + 4;
    local_f0 = (vector<unsigned_long,_true> *)(pGVar14 + 5);
    local_f8 = 0xffffffffffffffff;
    local_108 = local_120 + (local_120 == 0);
    lVar12 = 0;
    local_110 = pGVar14;
    do {
      pGVar14 = local_110;
      local_150 = lVar12;
      path = vector<duckdb::OpenFileInfo,_true>::operator[]
                       ((vector<duckdb::OpenFileInfo,_true> *)local_118,
                        (long)local_110[1]._vptr_GlobalTableFunctionState + lVar12);
      local_158._M_head_impl = (CachingFileHandle *)0x0;
      local_140 = path;
      if (*(char *)&pGVar14[8]._vptr_GlobalTableFunctionState == '\x01') {
        bVar6 = FileSystem::IsRemoteFile((string *)path);
        flags._8_8_ = (ulong)bVar6 * 4 + 1;
        flags.flags = (idx_t)path;
        CachingFileSystem::OpenFile
                  ((CachingFileSystem *)(local_e0 + 0x10),(OpenFileInfo *)local_e0,flags);
        uVar5 = local_d0._M_allocated_capacity;
        _Var4._M_head_impl = local_158._M_head_impl;
        local_d0._M_allocated_capacity = 0;
        local_158._M_head_impl = (CachingFileHandle *)uVar5;
        if (_Var4._M_head_impl != (CachingFileHandle *)0x0) {
          CachingFileHandle::~CachingFileHandle(_Var4._M_head_impl);
          operator_delete(_Var4._M_head_impl);
          uVar5 = local_d0._M_allocated_capacity;
          if ((CachingFileHandle *)local_d0._M_allocated_capacity != (CachingFileHandle *)0x0) {
            CachingFileHandle::~CachingFileHandle
                      ((CachingFileHandle *)local_d0._M_allocated_capacity);
            operator_delete((void *)uVar5);
          }
        }
      }
      if (pGVar14[6]._vptr_GlobalTableFunctionState != pGVar14[5]._vptr_GlobalTableFunctionState) {
        __n = 0;
        do {
          pvVar7 = vector<unsigned_long,_true>::operator[](local_f0,__n);
          if (*pvVar7 == local_f8) goto LAB_0117ecfe;
          switch(*pvVar7) {
          case 0:
            pvVar8 = vector<duckdb::Vector,_true>::operator[](&local_148->data,__n);
            sVar17 = StringVector::AddString(pvVar8,&local_140->path);
            pdVar2 = pvVar8->data;
            *(long *)(pdVar2 + local_150 * 0x10) = sVar17.value._0_8_;
            *(long *)(pdVar2 + local_150 * 0x10 + 8) = sVar17.value._8_8_;
            break;
          case 1:
            pCVar9 = unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>
                     ::operator->((unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>
                                   *)&local_158);
            vector = (Vector *)CachingFileHandle::GetFileSize(pCVar9);
            AssertMaxFileSize(&local_140->path,(idx_t)vector);
            pvVar8 = vector<duckdb::Vector,_true>::operator[](&local_148->data,__n);
            local_130 = (undefined1  [16])
                        StringVector::EmptyString((StringVector *)pvVar8,vector,len);
            uVar11 = local_130._0_8_;
            pVVar15 = vector;
            if (0 < (long)vector) {
              do {
                local_100 = pvVar8;
                pVVar16 = (Vector *)0x6400000;
                if (pVVar15 < (Vector *)0x6400000) {
                  pVVar16 = pVVar15;
                }
                pcVar13 = local_130 + 4;
                if (0xc < (uint)local_130._0_4_) {
                  pcVar13 = (char *)local_130._8_8_;
                }
                pCVar9 = unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>
                         ::operator->((unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>
                                       *)&local_158);
                bVar6 = CachingFileHandle::IsRemoteFile(pCVar9);
                if (bVar6) {
                  local_138 = NumericCastImpl<unsigned_long,_long,_false>::Convert((long)pVVar16);
                  pCVar9 = unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>
                           ::operator->((unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>
                                         *)&local_158);
                  CachingFileHandle::Read
                            ((BufferHandle *)(local_e0 + 0x10),pCVar9,&local_e8,&local_138);
                  switchD_012b9b0d::default
                            (pcVar13 + ((long)vector - (long)pVVar15),local_e8,local_138);
                  BufferHandle::~BufferHandle((BufferHandle *)(local_e0 + 0x10));
                }
                else {
                  pCVar9 = unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>
                           ::operator->((unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>
                                         *)&local_158);
                  this = CachingFileHandle::GetFileHandle(pCVar9);
                  val_00 = FileHandle::Read(this,pcVar13 + ((long)vector - (long)pVVar15),
                                            (idx_t)pVVar16);
                  local_138 = NumericCastImpl<unsigned_long,_long,_false>::Convert(val_00);
                }
                if (local_138 == 0) {
                  this_00 = (IOException *)__cxa_allocate_exception(0x10);
                  local_d0._M_allocated_capacity = (size_type)(local_e0 + 0x20);
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)(local_e0 + 0x10),
                             "Failed to read file \'%s\' at offset %lu, unexpected EOF","");
                  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
                  pcVar3 = (local_140->path)._M_dataplus._M_p;
                  ::std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_50,pcVar3,pcVar3 + (local_140->path)._M_string_length)
                  ;
                  IOException::IOException<std::__cxx11::string,long>
                            (this_00,(string *)(local_e0 + 0x10),&local_50,
                             (long)vector - (long)pVVar15);
                  __cxa_throw(this_00,&IOException::typeinfo,::std::runtime_error::~runtime_error);
                }
                lVar12 = NumericCastImpl<long,_unsigned_long,_false>::Convert(local_138);
                pVVar16 = (Vector *)((long)pVVar15 - lVar12);
                bVar6 = lVar12 <= (long)pVVar15;
                pVVar15 = pVVar16;
                pvVar8 = local_100;
              } while (pVVar16 != (Vector *)0x0 && bVar6);
              uVar11 = (ulong)(uint)local_130._0_4_;
            }
            if ((uint)uVar11 < 0xd) {
              switchD_012e3010::default
                        (local_130 + (uVar11 & 0xffffffff) + 4,0,0xc - (uVar11 & 0xffffffff));
            }
            else {
              local_130._4_4_ = *(undefined4 *)local_130._8_8_;
            }
            pdVar2 = pvVar8->data;
            *(undefined8 *)(pdVar2 + local_150 * 0x10) = local_130._0_8_;
            *(undefined8 *)(pdVar2 + local_150 * 0x10 + 8) = local_130._8_8_;
            break;
          case 2:
            pvVar8 = vector<duckdb::Vector,_true>::operator[](&local_148->data,__n);
            pCVar9 = unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>
                     ::operator->((unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>
                                   *)&local_158);
            val = CachingFileHandle::GetFileSize(pCVar9);
            tVar10.value = NumericCastImpl<long,_unsigned_long,_false>::Convert(val);
            goto LAB_0117eb78;
          case 3:
            pvVar8 = vector<duckdb::Vector,_true>::operator[](&local_148->data,__n);
            pCVar9 = unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>
                     ::operator->((unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>
                                   *)&local_158);
            sec = CachingFileHandle::GetLastModifiedTime(pCVar9);
            tVar10 = Timestamp::FromEpochSeconds(sec);
LAB_0117eb78:
            *(int64_t *)(pvVar8->data + local_150 * 8) = tVar10.value;
            break;
          default:
            this_01 = (InternalException *)__cxa_allocate_exception(0x10);
            local_d0._M_allocated_capacity = (size_type)(local_e0 + 0x20);
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)(local_e0 + 0x10),"Unsupported column index for read_file","");
            InternalException::InternalException(this_01,(string *)(local_e0 + 0x10));
            __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
LAB_0117ecfe:
          __n = __n + 1;
        } while (__n < (ulong)((long)local_110[6]._vptr_GlobalTableFunctionState -
                               (long)local_110[5]._vptr_GlobalTableFunctionState >> 3));
      }
      _Var4._M_head_impl = local_158._M_head_impl;
      if (local_158._M_head_impl != (CachingFileHandle *)0x0) {
        CachingFileHandle::~CachingFileHandle(local_158._M_head_impl);
        operator_delete(_Var4._M_head_impl);
      }
      lVar12 = local_150 + 1;
      pGVar14 = local_110;
    } while (lVar12 != local_108);
  }
  LOCK();
  pGVar14[1]._vptr_GlobalTableFunctionState =
       (_func_int **)((long)pGVar14[1]._vptr_GlobalTableFunctionState + local_120);
  UNLOCK();
  local_148->count = local_120;
  CachingFileSystem::~CachingFileSystem((CachingFileSystem *)local_e0);
  return;
}

Assistant:

static void ReadFileExecute(ClientContext &context, TableFunctionInput &input, DataChunk &output) {
	auto &bind_data = input.bind_data->Cast<ReadFileBindData>();
	auto &state = input.global_state->Cast<ReadFileGlobalState>();
	auto fs = CachingFileSystem::Get(context);

	auto output_count = MinValue<idx_t>(STANDARD_VECTOR_SIZE, bind_data.files.size() - state.current_file_idx);

	// We utilize projection pushdown here to only read the file content if the 'data' column is requested
	for (idx_t out_idx = 0; out_idx < output_count; out_idx++) {
		// Add the file name to the output
		auto &file = bind_data.files[state.current_file_idx + out_idx];

		unique_ptr<CachingFileHandle> file_handle = nullptr;

		// Given the columns requested, do we even need to open the file?
		if (state.requires_file_open) {
			auto flags = FileFlags::FILE_FLAGS_READ;
			if (FileSystem::IsRemoteFile(file.path)) {
				flags |= FileFlags::FILE_FLAGS_DIRECT_IO;
			}
			file_handle = fs.OpenFile(file, flags);
		}

		for (idx_t col_idx = 0; col_idx < state.column_ids.size(); col_idx++) {
			// We utilize projection pushdown to avoid potentially expensive fs operations.
			auto proj_idx = state.column_ids[col_idx];
			if (proj_idx == COLUMN_IDENTIFIER_ROW_ID) {
				continue;
			}
			try {
				switch (proj_idx) {
				case ReadFileBindData::FILE_NAME_COLUMN: {
					auto &file_name_vector = output.data[col_idx];
					auto file_name_string = StringVector::AddString(file_name_vector, file.path);
					FlatVector::GetData<string_t>(file_name_vector)[out_idx] = file_name_string;
				} break;
				case ReadFileBindData::FILE_CONTENT_COLUMN: {
					auto file_size_raw = file_handle->GetFileSize();
					AssertMaxFileSize(file.path, file_size_raw);
					auto file_size = UnsafeNumericCast<int64_t>(file_size_raw);
					auto &file_content_vector = output.data[col_idx];
					auto content_string = StringVector::EmptyString(file_content_vector, file_size_raw);

					auto remaining_bytes = UnsafeNumericCast<int64_t>(file_size);

					// Read in batches of 100mb
					constexpr auto MAX_READ_SIZE = 100LL * 1024 * 1024;
					while (remaining_bytes > 0) {
						const auto bytes_to_read = MinValue<int64_t>(remaining_bytes, MAX_READ_SIZE);
						const auto content_string_ptr =
						    content_string.GetDataWriteable() + (file_size - remaining_bytes);

						idx_t actually_read;
						if (file_handle->IsRemoteFile()) {
							// Remote file: caching read
							data_ptr_t read_ptr;
							actually_read = NumericCast<idx_t>(bytes_to_read);
							auto buffer_handle = file_handle->Read(read_ptr, actually_read);
							memcpy(content_string_ptr, read_ptr, actually_read);
						} else {
							// Local file: non-caching read
							actually_read = NumericCast<idx_t>(file_handle->GetFileHandle().Read(
							    content_string_ptr, UnsafeNumericCast<idx_t>(bytes_to_read)));
						}

						if (actually_read == 0) {
							// Uh oh, random EOF?
							throw IOException("Failed to read file '%s' at offset %lu, unexpected EOF", file.path,
							                  file_size - remaining_bytes);
						}
						remaining_bytes -= NumericCast<int64_t>(actually_read);
					}

					content_string.Finalize();

					OP::VERIFY(file.path, content_string);

					FlatVector::GetData<string_t>(file_content_vector)[out_idx] = content_string;
				} break;
				case ReadFileBindData::FILE_SIZE_COLUMN: {
					auto &file_size_vector = output.data[col_idx];
					FlatVector::GetData<int64_t>(file_size_vector)[out_idx] =
					    NumericCast<int64_t>(file_handle->GetFileSize());
				} break;
				case ReadFileBindData::FILE_LAST_MODIFIED_COLUMN: {
					auto &last_modified_vector = output.data[col_idx];
					// This can sometimes fail (e.g. httpfs file system cant always parse the last modified time
					// correctly)
					try {
						auto timestamp_seconds = Timestamp::FromEpochSeconds(file_handle->GetLastModifiedTime());
						FlatVector::GetData<timestamp_tz_t>(last_modified_vector)[out_idx] =
						    timestamp_tz_t(timestamp_seconds);
					} catch (std::exception &ex) {
						ErrorData error(ex);
						if (error.Type() == ExceptionType::CONVERSION) {
							FlatVector::SetNull(last_modified_vector, out_idx, true);
						} else {
							throw;
						}
					}
				} break;
				default:
					throw InternalException("Unsupported column index for read_file");
				}
			}
			// Filesystems are not required to support all operations, so we just set the column to NULL if not
			// implemented
			catch (std::exception &ex) {
				ErrorData error(ex);
				if (error.Type() == ExceptionType::NOT_IMPLEMENTED) {
					FlatVector::SetNull(output.data[col_idx], out_idx, true);
				} else {
					throw;
				}
			}
		}
	}

	state.current_file_idx += output_count;
	output.SetCardinality(output_count);
}